

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.cc
# Opt level: O0

void __thiscall gss::Timeout::Timeout(Timeout *this,seconds limit)

{
  bool bVar1;
  type *in_RDI;
  thread *in_stack_ffffffffffffff98;
  memory_order in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 uVar2;
  type *__lhs;
  thread *in_stack_ffffffffffffffd0;
  
  __lhs = in_RDI;
  std::make_unique<gss::Timeout::Detail>();
  std::unique_ptr<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_>::operator->
            ((unique_ptr<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_> *)
             0x14aa6f);
  std::atomic<bool>::store
            ((atomic<bool> *)in_RDI,SUB41((uint)in_stack_ffffffffffffffa4 >> 0x18,0),
             in_stack_ffffffffffffffa0);
  s<(char)48>();
  bVar1 = std::chrono::operator==(&__lhs->limit,&in_RDI->limit);
  uVar2 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffa4);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::thread::
    thread<gss::Timeout::Timeout(std::chrono::duration<long,std::ratio<1l,1l>>)::__0,,void>
              (in_stack_ffffffffffffffd0,in_RDI);
    std::unique_ptr<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_>::operator->
              ((unique_ptr<gss::Timeout::Detail,_std::default_delete<gss::Timeout::Detail>_> *)
               0x14aae8);
    std::thread::operator=
              ((thread *)CONCAT44(uVar2,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
    std::thread::~thread((thread *)0x14ab03);
  }
  return;
}

Assistant:

Timeout::Timeout(const seconds limit) :
    _detail(make_unique<Detail>())
{
    _detail->abort.store(false);
    if (0s != limit) {
        _detail->timeout_thread = thread([limit, &detail = this->_detail] {
            auto abort_time = system_clock::now() + limit;
            {
                /* Sleep until either we've reached the time limit,
                 * or we've finished all the work. */
                unique_lock<mutex> guard(detail->timeout_mutex);
                while (! detail->abort.load()) {
                    if (cv_status::timeout == detail->timeout_cv.wait_until(guard, abort_time)) {
                        /* We've woken up, and it's due to a timeout. */
                        detail->aborted = true;
                        break;
                    }
                }
            }
            detail->abort.store(true);
        });
    }
}